

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_InitTiming(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Ntk_t *pNtk_local;
  
  pManMR->nExactConstraints = 0;
  pManMR->nConservConstraints = 0;
  pVVar2 = Vec_PtrAlloc(1000);
  pManMR->vExactNodes = pVVar2;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  pVVar2 = (Vec_Ptr_t *)malloc((long)(iVar1 + 1) << 4);
  pManMR->vTimeEdges = pVVar2;
  if (pManMR->vTimeEdges != (Vec_Ptr_t *)0x0) {
    pVVar2 = pManMR->vTimeEdges;
    iVar1 = Abc_NtkObjNumMax(pNtk);
    memset(pVVar2,0,(long)(iVar1 + 1) << 4);
    return;
  }
  __assert_fail("pManMR->vTimeEdges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretTime.c"
                ,0x4a,"void Abc_FlowRetime_InitTiming(Abc_Ntk_t *)");
}

Assistant:

void Abc_FlowRetime_InitTiming( Abc_Ntk_t *pNtk ) {

  pManMR->nConservConstraints = pManMR->nExactConstraints = 0;

  pManMR->vExactNodes = Vec_PtrAlloc(1000);

  pManMR->vTimeEdges = ABC_ALLOC( Vec_Ptr_t, Abc_NtkObjNumMax(pNtk)+1 );
  assert(pManMR->vTimeEdges);
  memset(pManMR->vTimeEdges, 0, (Abc_NtkObjNumMax(pNtk)+1) * sizeof(Vec_Ptr_t) );
}